

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void mxx::print_node_distribution(MPI_Comm comm)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  mapped_type *this;
  _Base_ptr p_Var3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  pointer pcVar7;
  pointer ppVar8;
  long lVar9;
  int *piVar10;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  __i;
  long lVar11;
  pointer ppVar12;
  value_type_conflict local_204;
  int p;
  int rank;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  proc_distr;
  int p_len;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_names;
  vector<char,_std::allocator<char>_> all_names_raw;
  undefined1 local_1a8 [56];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  procs_per_node;
  MPI_Comm comm_local;
  char p_name [257];
  
  comm_local = comm;
  MPI_Comm_rank(comm,&rank);
  MPI_Comm_size(comm,&p);
  MPI_Get_processor_name(p_name,&p_len);
  p_name[p_len] = '\0';
  mxx::comm::comm((comm *)local_1a8,&comm_local);
  gatherv<char>(&all_names_raw,p_name,(long)p_len + 1,0,(comm *)local_1a8);
  mxx::comm::~comm((comm *)local_1a8);
  if (rank == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&all_names,(long)p,(allocator_type *)local_1a8);
    local_204 = 0;
    for (pcVar7 = all_names_raw.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar7 != all_names_raw.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 1) {
      if (*pcVar7 == '\0') {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)local_1a8,
                   all_names_raw.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,pcVar7);
        lVar9 = (long)local_204;
        local_204 = local_204 + 1;
        std::__cxx11::string::operator=
                  ((string *)
                   (all_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar9),(string *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
        all_names_raw.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar7 + 1;
      }
    }
    if (local_204 != p) {
      __assert_fail("i == p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/utils.hpp"
                    ,0x5a,"void mxx::print_node_distribution(MPI_Comm)");
    }
    p_Var1 = &procs_per_node._M_t._M_impl.super__Rb_tree_header;
    procs_per_node._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    procs_per_node._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    procs_per_node._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar6 = 0;
    procs_per_node._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    procs_per_node._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    while (iVar6 < local_204) {
      local_204 = iVar6;
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&procs_per_node,
                          all_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar6);
      std::vector<int,_std::allocator<int>_>::push_back(this,&local_204);
      iVar6 = local_204 + 1;
      local_204 = p;
    }
    local_204 = iVar6;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector(&proc_distr,procs_per_node._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)local_1a8);
    local_204 = 0;
    for (p_Var3 = procs_per_node._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ppVar2 = proc_distr.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        ppVar8 = proc_distr.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var3 != p_Var1;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::pair<std::vector<int,_std::allocator<int>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1),
                 (vector<int,_std::allocator<int>_> *)(p_Var3 + 2));
      lVar9 = (long)local_204;
      local_204 = local_204 + 1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::operator=(proc_distr.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar9,
                  (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                   *)local_1a8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               *)local_1a8);
    }
    if (proc_distr.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        proc_distr.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar11 = (long)proc_distr.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)proc_distr.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = lVar11 / 0x38;
      lVar9 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                (proc_distr.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 proc_distr.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x381) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar8,ppVar2);
      }
      else {
        ppVar12 = ppVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar8,ppVar12);
        for (; ppVar12 != ppVar2; ppVar12 = ppVar12 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Val_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                    (ppVar12);
        }
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"== Node distribution == ");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cerr,"== p=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,p);
    poVar5 = std::operator<<(poVar5," processes on ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," nodes ==");
    std::endl<char,std::char_traits<char>>(poVar5);
    for (ppVar8 = proc_distr.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar8 != proc_distr.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"--  Node: \'");
      poVar5 = std::operator<<(poVar5,(string *)ppVar8);
      poVar5 = std::operator<<(poVar5,"\' (");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"/");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,p);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::operator<<((ostream *)&std::cerr,"        Ranks: ");
      piVar10 = (ppVar8->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (piVar10 !=
             (ppVar8->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        std::ostream::operator<<(&std::cerr,*piVar10);
        piVar10 = piVar10 + 1;
        if (piVar10 !=
            (ppVar8->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator<<((ostream *)&std::cerr,", ");
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&proc_distr);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&procs_per_node._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&all_names);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&all_names_raw.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void print_node_distribution(MPI_Comm comm = MPI_COMM_WORLD)
{
    // get MPI parameters
    int rank;
    int p;
    MPI_Comm_rank(comm, &rank);
    MPI_Comm_size(comm, &p);

    // get local processor name
    char p_name[MPI_MAX_PROCESSOR_NAME+1];
    int p_len;
    MPI_Get_processor_name(p_name, &p_len);
    p_name[p_len] = '\0'; // make string NULL-terminated (if not yet so)

    // gather all processor names to master
    // TODO: use gather with string specialization!
    std::vector<char> all_names_raw = gatherv(p_name,p_len+1, 0,comm);

    if (rank == 0)
    {
        std::vector<std::string> all_names(p);
        // disect the names into a set of strings
        std::vector<char>::iterator str_start = all_names_raw.begin();
        int i = 0;
        for (auto it = all_names_raw.begin(); it != all_names_raw.end(); ++it)
        {
            if (*it == '\0')
            {
                all_names[i++] = std::string(str_start, it);
                str_start = it+1;
            }
        }
        assert(i == p);
        std::map<std::string, std::vector<int> > procs_per_node;
        for (i = 0; i < p; ++i)
        {
            procs_per_node[all_names[i]].push_back(i);
        }
        // create array instead of map, then we can sort by first rank
        std::vector<std::pair<std::string, std::vector<int> > > proc_distr(procs_per_node.size());
        i = 0;
        for (auto it = procs_per_node.begin(); it != procs_per_node.end(); ++it)
        {
            // sort procs on each node
            std::sort(it->second.begin(), it->second.end());
            // put into the vector
            proc_distr[i++] = std::make_pair(it->first, it->second);
        }
        // sort the vector of node names by first rank
        std::sort(proc_distr.begin(), proc_distr.end(),
                  [](const std::pair<std::string, std::vector<int> >& x,
                     const std::pair<std::string, std::vector<int> >& y)
                  { return x.second.front() < y.second.front();});

        // print out the rank distribution
        std::cerr << "== Node distribution == " << std::endl;
        std::cerr << "== p=" << p << " processes on " << proc_distr.size() << " nodes ==" << std::endl;
        for (auto it = proc_distr.begin(); it != proc_distr.end(); ++it)
        {
            std::cerr << "--  Node: '" << it->first << "' (" << it->second.size() << "/" << p << ")" << std::endl;
            std::cerr << "        Ranks: ";
            for (auto rank_it = it->second.begin(); rank_it != it->second.end(); ++rank_it)
            {
                std::cerr << *rank_it;
                if (rank_it+1 != it->second.end())
                    std::cerr << ", ";
            }
            std::cerr << std::endl;
        }
    }
}